

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O2

void __thiscall
xray_re::cse_alife_level_changer::cse_alife_level_changer(cse_alife_level_changer *this)

{
  cse_alife_space_restrictor::cse_alife_space_restrictor(&this->super_cse_alife_space_restrictor);
  (this->super_cse_alife_space_restrictor).super_cse_alife_dynamic_object.super_cse_alife_object.
  super_cse_abstract._vptr_cse_abstract = (_func_int **)&PTR__cse_alife_level_changer_002365a8;
  (this->super_cse_alife_space_restrictor).super_cse_shape._vptr_cse_shape =
       (_func_int **)&PTR__cse_alife_level_changer_00236610;
  *(undefined2 *)&(this->super_cse_alife_space_restrictor).field_0x13a = 0xffff;
  *(undefined4 *)&(this->super_cse_alife_space_restrictor).field_0x13c = 0xffffffff;
  (this->m_level_to_change)._M_dataplus._M_p = (pointer)&(this->m_level_to_change).field_2;
  (this->m_level_to_change)._M_string_length = 0;
  (this->m_level_to_change).field_2._M_local_buf[0] = '\0';
  (this->m_level_point_to_change)._M_dataplus._M_p =
       (pointer)&(this->m_level_point_to_change).field_2;
  (this->m_level_point_to_change)._M_string_length = 0;
  (this->m_level_point_to_change).field_2._M_local_buf[0] = '\0';
  this->m_silent_mode = false;
  *(undefined8 *)&(this->m_next_position).field_0 = 0;
  *(undefined8 *)((long)&(this->m_next_position).field_0 + 8) = 0;
  *(undefined8 *)((long)&(this->m_angles).field_0 + 4) = 0;
  return;
}

Assistant:

cse_alife_level_changer::cse_alife_level_changer():
	m_next_graph_id(UNDEF16), m_next_node_id(UNDEF32),
	m_silent_mode(false)
{
	m_next_position.set();
	m_angles.set();
}